

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

void __thiscall
cs::method_import::preprocess
          (method_import *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  iterator *piVar1;
  value_type ptVar2;
  token_base *ptVar3;
  _func_int **pp_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  _Elt_pointer pdVar7;
  _Elt_pointer ppsVar8;
  int iVar9;
  const_reference pptVar10;
  token_base **pptVar11;
  tree_node *ptVar12;
  internal_error *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Elt_pointer pptVar13;
  _func_int **pp_Var14;
  tree_type<cs::token_base_*> *t;
  _func_int **pp_Var15;
  tree_type<cs::token_base_*> *t_00;
  size_t sVar16;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  var_list;
  anon_class_16_2_05505a5e process;
  iterator local_90;
  undefined1 local_88 [32];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  local_68;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_50;
  method_import *local_48;
  anon_class_16_2_05505a5e local_40;
  
  t_00 = (tree_type<cs::token_base_*> *)0x1;
  pptVar10 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                       ((raw->
                        super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                        )._M_impl.super__Deque_impl_data._M_start._M_cur,1);
  ptVar2 = *pptVar10;
  local_88._0_8_ = ptVar2[1]._vptr_token_base;
  pptVar11 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_88);
  if (*pptVar11 == (token_base *)0x0) {
    this_00 = (internal_error *)__cxa_allocate_exception(0x28);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"Null pointer accessed.","");
    internal_error::internal_error(this_00,(string *)local_88);
    __cxa_throw(this_00,&internal_error::typeinfo,internal_error::~internal_error);
  }
  local_88._0_8_ = (tree_node *)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  local_90.mData = (tree_node *)ptVar2[1]._vptr_token_base;
  local_40.context = context;
  local_40.var_list =
       (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
        *)local_88;
  pptVar11 = tree_type<cs::token_base_*>::iterator::data(&local_90);
  iVar9 = (*(*pptVar11)->_vptr_token_base[2])();
  local_50 = raw;
  local_48 = this;
  if (iVar9 == 0xf) {
    local_90.mData = (tree_node *)ptVar2[1]._vptr_token_base;
    pptVar11 = tree_type<cs::token_base_*>::iterator::data(&local_90);
    ptVar3 = *pptVar11;
    pp_Var15 = ptVar3[2]._vptr_token_base;
    pp_Var4 = ptVar3[4]._vptr_token_base;
    if (pp_Var15 != pp_Var4) {
      pp_Var14 = ptVar3[3]._vptr_token_base;
      sVar16 = ptVar3[3].line_num;
      do {
        t_00 = (tree_type<cs::token_base_*> *)*pp_Var15;
        preprocess::anon_class_16_2_05505a5e::operator()(&local_40,t_00);
        pp_Var15 = pp_Var15 + 1;
        if (pp_Var15 == pp_Var14) {
          pp_Var15 = *(_func_int ***)(sVar16 + 8);
          sVar16 = sVar16 + 8;
          pp_Var14 = pp_Var15 + 0x40;
        }
      } while (pp_Var15 != pp_Var4);
    }
  }
  else {
    t_00 = (tree_type<cs::token_base_*> *)ptVar2[1]._vptr_token_base;
    preprocess::anon_class_16_2_05505a5e::operator()(&local_40,t_00);
  }
  ptVar12 = (tree_node *)statement_base::operator_new((statement_base *)0x38,(size_t)t_00);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ::vector(&local_68,
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
            *)local_88);
  peVar5 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var6 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    }
  }
  pdVar7 = (local_50->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar13 = (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pptVar13 ==
      (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar13 = (pdVar7->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ptVar3 = pptVar13[-1];
  (((context_t *)&ptVar12->left)->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = peVar5;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptVar12->right)->_M_pi = p_Var6;
  ptVar12->data = (token_base *)ptVar3->line_num;
  ptVar12->root = (tree_node *)&PTR__statement_import_0025d0c0;
  ptVar12[1].root =
       (tree_node *)
       local_68.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (((context_t *)&ptVar12[1].left)->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)
             local_68.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&ptVar12[1].right)->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_68.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppsVar8 = (local_48->mResult).
            super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  local_90.mData = ptVar12;
  if (ppsVar8 ==
      (local_48->mResult).
      super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    _M_push_back_aux<cs::statement_import*>
              ((deque<cs::statement_base*,std::allocator<cs::statement_base*>> *)&local_48->mResult,
               (statement_import **)&local_90);
  }
  else {
    *ppsVar8 = (statement_base *)ptVar12;
    piVar1 = &(local_48->mResult).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ::~vector(&local_68);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
             *)local_88);
  return;
}

Assistant:

void method_import::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		if (tree.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		std::vector<std::pair<std::string, var>> var_list;
		auto process = [&context, &var_list](tree_type<token_base *> &t) {
			token_base *token = t.root().data();
			if (token == nullptr || token->get_type() != token_types::id)
				throw compile_error("Wrong grammar for import statement, expect <package name>");
			const var_id &package_name = static_cast<token_id *>(token)->get_id();
			const var &ext = make_namespace(context->instance->import(current_process->import_path, package_name));
			context->compiler->add_constant(ext);
			context->instance->storage.add_var_no_return(package_name, ext);
			var_list.emplace_back(package_name, ext);
		};
		if (tree.root().data()->get_type() == token_types::parallel) {
			auto &parallel_list = static_cast<token_parallel *>(tree.root().data())->get_parallel();
			for (auto &t: parallel_list)
				process(t);
		}
		else
			process(tree);
		mResult.emplace_back(new statement_import(var_list, context, raw.front().back()));
	}